

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_merge_event.cpp
# Opt level: O3

void __thiscall duckdb::ArrowBatchTask::ProduceRecordBatches(ArrowBatchTask *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  idx_t chunk_size;
  vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
  *this_00;
  reference this_01;
  ArrowArray *out;
  Event *this_02;
  ClientContext *context;
  vector<duckdb::LogicalType,_true> *duckdb_types;
  size_type *psVar3;
  ClientProperties arrow_options;
  ClientProperties local_c8;
  ClientProperties local_98;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this_00 = ArrowQueryResult::Arrays(this->result);
  ClientContext::GetClientProperties(&local_98,((this->super_ExecutorTask).executor)->context);
  psVar3 = (this->record_batch_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->record_batch_indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar3 != psVar2) {
    paVar1 = &local_c8.time_zone.field_2;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
                ::operator[](this_00,*psVar3);
      local_c8.time_zone._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_98.time_zone._M_dataplus._M_p,
                 local_98.time_zone._M_dataplus._M_p + local_98.time_zone._M_string_length);
      local_c8.arrow_offset_size = local_98.arrow_offset_size;
      local_c8.arrow_use_list_view = local_98.arrow_use_list_view;
      local_c8.produce_arrow_string_view = local_98.produce_arrow_string_view;
      local_c8.arrow_lossless_conversion = local_98.arrow_lossless_conversion;
      local_c8._36_4_ = local_98._36_4_;
      local_c8.client_context.ptr = local_98.client_context.ptr;
      chunk_size = this->batch_size;
      out = &unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
             ::operator->(this_01)->arrow_array;
      this_02 = shared_ptr<duckdb::Event,_true>::operator->(&this->event);
      context = Event::GetClientContext(this_02);
      duckdb_types = BatchCollectionChunkScanState::Types(&this->scan_state);
      ArrowTypeExtensionData::GetExtensionTypes
                ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_68,context,duckdb_types);
      ArrowUtil::FetchChunk
                (&(this->scan_state).super_ChunkScanState,&local_c8,chunk_size,out,
                 (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_68);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.time_zone._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.time_zone._M_dataplus._M_p);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.time_zone._M_dataplus._M_p != &local_98.time_zone.field_2) {
    operator_delete(local_98.time_zone._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ArrowBatchTask::ProduceRecordBatches() {
	auto &arrays = result.Arrays();
	auto arrow_options = executor.context.GetClientProperties();
	for (auto &index : record_batch_indices) {
		auto &array = arrays[index];
		D_ASSERT(array);
		const idx_t count = ArrowUtil::FetchChunk(
		    scan_state, arrow_options, batch_size, &array->arrow_array,
		    ArrowTypeExtensionData::GetExtensionTypes(event->GetClientContext(), scan_state.Types()));
		(void)count;
		D_ASSERT(count != 0);
	}
}